

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  float *pfVar5;
  char *in_RCX;
  char *in_RDX;
  long *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  uint in_R9D;
  bool bVar6;
  float in_XMM0_Da;
  float fVar7;
  float fVar8;
  float unaff_retaddr;
  undefined1 unaff_retaddr_00;
  longlong in_stack_00000008;
  longlong in_stack_00000010;
  float in_stack_00000018;
  ImGuiDataType in_stack_0000001c;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  longlong v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  float tweak_factor;
  bool tweak_fast;
  bool tweak_slow;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_wrapped;
  bool is_bounded;
  ImGuiAxis axis;
  ImGuiContext *g;
  bool local_a3;
  int in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  uint3 in_stack_ffffffffffffff74;
  uint3 uVar9;
  uint uVar10;
  char *local_68;
  float local_4c;
  undefined4 in_stack_ffffffffffffffc8;
  ImGuiDataType data_type_00;
  undefined4 in_stack_ffffffffffffffe8;
  float in_stack_fffffffffffffffc;
  bool bVar11;
  ImGuiAxis axis_00;
  
  pIVar1 = GImGui;
  data_type_00 = (ImGuiDataType)((ulong)in_R8 >> 0x20);
  uVar4 = (uint)((in_R9D & 0x100000) != 0);
  bVar11 = (long)in_RDX < (long)in_RCX;
  uVar10 = (uint)in_stack_ffffffffffffff74;
  if (bVar11) {
    uVar10 = CONCAT13((in_R9D & 0x100) != 0,in_stack_ffffffffffffff74);
  }
  bVar6 = (in_R9D & 0x20) != 0;
  uVar9 = CONCAT12(1,(short)uVar10);
  if (in_EDI != 8) {
    uVar9 = CONCAT12(in_EDI == 9,(short)uVar10);
  }
  axis_00 = CONCAT13((char)(uVar10 >> 0x18),uVar9);
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (bVar11)) &&
     ((float)((long)in_RCX - (long)in_RDX) < 3.4028235e+38)) {
    in_XMM0_Da = (float)((long)in_RCX - (long)in_RDX) * GImGui->DragSpeedDefaultRatio;
  }
  local_4c = 0.0;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar2 = IsMousePosValid((ImVec2 *)0x0), bVar2)) &&
     (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), bVar2)) {
    pfVar5 = ImVec2::operator[](&(pIVar1->IO).MouseDelta,(long)(int)uVar4);
    local_4c = *pfVar5;
    if (((pIVar1->IO).KeyAlt & 1U) != 0) {
      local_4c = local_4c * 0.01;
    }
    if (((pIVar1->IO).KeyShift & 1U) != 0) {
      local_4c = local_4c * 10.0;
    }
  }
  else if ((pIVar1->ActiveIdSource == ImGuiInputSource_Keyboard) ||
          (pIVar1->ActiveIdSource == ImGuiInputSource_Gamepad)) {
    if ((uVar9 & 0x10000) != 0) {
      ImParseFormatPrecision
                ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff64);
    }
    bVar2 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    bVar3 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
    if (bVar2) {
      fVar7 = 0.1;
    }
    else {
      in_stack_ffffffffffffff64 = 0x3f800000;
      in_stack_ffffffffffffff68 = 10.0;
      fVar7 = in_stack_ffffffffffffff68;
      if (!bVar3) {
        in_stack_ffffffffffffff68 = 1.0;
        fVar7 = in_stack_ffffffffffffff68;
      }
    }
    in_stack_ffffffffffffff6c = fVar7;
    local_4c = GetNavTweakPressedAmount(axis_00);
    local_4c = local_4c * fVar7;
    fVar7 = GetMinimumStepAtDecimalPrecision((int)in_XMM0_Da);
    in_XMM0_Da = ImMax<float>(in_XMM0_Da,fVar7);
  }
  local_4c = in_XMM0_Da * local_4c;
  if (uVar4 == 1) {
    local_4c = -local_4c;
  }
  if (((bVar6) && ((float)((long)in_RCX - (long)in_RDX) < 3.4028235e+38)) &&
     (1e-06 < (float)((long)in_RCX - (long)in_RDX))) {
    local_4c = local_4c / (float)((long)in_RCX - (long)in_RDX);
  }
  local_a3 = false;
  if (((bVar11) && (local_a3 = false, (uVar10 & 0x1000000) == 0)) &&
     ((*in_RSI < (long)in_RCX || (local_a3 = true, local_4c <= 0.0)))) {
    local_a3 = *in_RSI <= (long)in_RDX && local_4c < 0.0;
  }
  if (((pIVar1->ActiveIdIsJustActivated & 1U) != 0) || (local_a3)) {
    pIVar1->DragCurrentAccum = 0.0;
    pIVar1->DragCurrentAccumDirty = false;
  }
  else if ((local_4c != 0.0) || (NAN(local_4c))) {
    pIVar1->DragCurrentAccum = local_4c + pIVar1->DragCurrentAccum;
    pIVar1->DragCurrentAccumDirty = true;
  }
  if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
    bVar11 = false;
  }
  else {
    fVar7 = 0.0;
    if (bVar6) {
      if ((uVar9 & 0x10000) != 0) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff64);
      }
      ImPow(0.0,3.674097e-39);
      fVar7 = ScaleRatioFromValueT<long_long,long_long,double>
                        ((ImGuiDataType)unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (longlong)in_RSI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_RDX >> 0x38,0),SUB84(in_RDX,0),
                         (float)((ulong)in_RCX >> 0x20));
      local_68 = (char *)ScaleValueFromRatioT<long_long,long_long,double>
                                   (in_stack_0000001c,in_stack_00000018,in_stack_00000010,
                                    in_stack_00000008,(bool)unaff_retaddr_00,unaff_retaddr,
                                    in_stack_fffffffffffffffc);
    }
    else {
      local_68 = (char *)((long)pIVar1->DragCurrentAccum + *in_RSI);
    }
    if (((char)(uVar9 >> 0x10) != '\0') && ((in_R9D & 0x40) == 0)) {
      local_68 = (char *)RoundScalarWithFormatT<long_long>
                                   (in_RCX,data_type_00,CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
    }
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar6) {
      fVar8 = ScaleRatioFromValueT<long_long,long_long,double>
                        ((ImGuiDataType)unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (longlong)in_RSI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_RDX >> 0x38,0),SUB84(in_RDX,0),
                         (float)((ulong)in_RCX >> 0x20));
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (fVar8 - fVar7);
    }
    else {
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)((long)local_68 - *in_RSI);
    }
    if (local_68 == (char *)0x0) {
      local_68 = (char *)0x0;
    }
    if (((char *)*in_RSI != local_68) && (bVar11)) {
      if ((uVar10 & 0x1000000) == 0) {
        if (((long)local_68 < (long)in_RDX) ||
           (((*in_RSI < (long)local_68 && (local_4c < 0.0)) && ((uVar9 & 0x10000) == 0)))) {
          local_68 = in_RDX;
        }
        if (((long)in_RCX < (long)local_68) ||
           ((((long)local_68 < *in_RSI && (0.0 < local_4c)) && ((uVar9 & 0x10000) == 0)))) {
          local_68 = in_RCX;
        }
      }
      else {
        if ((long)local_68 < (long)in_RDX) {
          local_68 = local_68 +
                     (long)(in_RCX + ((long)(int)(uint)((uVar9 & 0x10000) == 0) - (long)in_RDX));
        }
        if ((long)in_RCX < (long)local_68) {
          local_68 = local_68 +
                     -(long)(in_RCX + ((long)(int)(uint)((uVar9 & 0x10000) == 0) - (long)in_RDX));
        }
      }
    }
    if ((char *)*in_RSI == local_68) {
      bVar11 = false;
    }
    else {
      *in_RSI = (long)local_68;
      bVar11 = true;
    }
  }
  return bVar11;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_bounded = (v_min < v_max);
    const bool is_wrapped = is_bounded && (flags & ImGuiSliderFlags_WrapAround);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_bounded && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 10.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    const bool is_just_activated = g.ActiveIdIsJustActivated;
    const bool is_already_past_limits_and_pushing_outward = is_bounded && !is_wrapped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    if (*v != v_cur && is_bounded)
    {
        if (is_wrapped)
        {
            // Wrap values
            if (v_cur < v_min)
                v_cur += v_max - v_min + (is_floating_point ? 0 : 1);
            if (v_cur > v_max)
                v_cur -= v_max - v_min + (is_floating_point ? 0 : 1);
        }
        else
        {
            // Clamp values + handle overflow/wrap-around for integer types.
            if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
                v_cur = v_min;
            if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
                v_cur = v_max;
        }
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}